

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# move.c
# Opt level: O0

void move_print(Board *board,Move *move,_Bool indent)

{
  byte bVar1;
  byte bVar2;
  uint uVar3;
  code *pcVar4;
  uint uVar5;
  char *pcVar6;
  char *pcVar7;
  Spot *pSVar8;
  byte in_DL;
  byte *in_RSI;
  undefined8 uVar9;
  Board *in_RDI;
  char *pcVar10;
  Card *toCard;
  uchar i;
  uchar toSpotCardIndex;
  uchar fromSpotCardIndex;
  Spot *toSpot;
  Spot *fromSpot;
  char buf [1024];
  undefined1 in_stack_fffffffffffffadf;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffffae4;
  MovePack *in_stack_fffffffffffffae8;
  Board *in_stack_fffffffffffffaf0;
  char *local_4e0;
  char *local_498;
  Card *local_480;
  Card *local_478;
  byte local_470;
  byte local_468;
  Spot *local_458;
  Spot *local_450;
  byte local_43b;
  char local_428 [1039];
  byte local_19;
  byte *local_18;
  Board *local_10;
  
  local_19 = in_DL & 1;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if (*in_RSI == 3) {
    local_450 = (Spot *)0x0;
  }
  else {
    local_450 = board_spotGet(in_RDI,in_RSI[1],in_RSI[2]);
  }
  if ((*local_18 == 0) || (*local_18 == 1)) {
    local_458 = board_spotGet(local_10,local_18[8],local_18[9]);
  }
  else {
    local_458 = (Spot *)0x0;
  }
  if (((local_450 != (Spot *)0x0) && (*(int *)(local_18 + 4) == -1)) &&
     (SBORROW4((uint)local_450->cardsCount,1))) {
    pcVar4 = (code *)invalidInstructionException();
    (*pcVar4)();
  }
  if (local_458 == (Spot *)0x0) {
    local_468 = 0;
  }
  else {
    if (*(int *)(local_18 + 0xc) == -1) {
      local_470 = local_458->cardsCount - 1;
      if (SBORROW4((uint)local_458->cardsCount,1)) {
        pcVar4 = (code *)invalidInstructionException();
        (*pcVar4)();
      }
    }
    else {
      local_470 = (byte)*(undefined4 *)(local_18 + 0xc);
    }
    local_468 = local_470;
  }
  if (local_458 == (Spot *)0x0) {
    local_478 = (Card *)0x0;
  }
  else {
    if (local_458->cardsCount == '\0') {
      local_480 = (Card *)0x0;
    }
    else {
      local_480 = local_458->cards[local_468];
    }
    local_478 = local_480;
  }
  if (((*local_18 == 0) || (*local_18 == 1)) && (local_450 != (Spot *)0x0)) {
    pcVar6 = cards_print((Card **)in_stack_fffffffffffffaf0,
                         (uchar)((ulong)in_stack_fffffffffffffae8 >> 0x38),
                         SUB81((ulong)in_stack_fffffffffffffae8 >> 0x30,0));
    if (local_478 == (Card *)0x0) {
      local_498 = "TOP";
    }
    else {
      local_498 = cards_print((Card **)in_stack_fffffffffffffaf0,
                              (uchar)((ulong)in_stack_fffffffffffffae8 >> 0x38),
                              SUB81((ulong)in_stack_fffffffffffffae8 >> 0x30,0));
    }
    sprintf(local_428,"%s => %s",pcVar6,local_498);
    uVar5 = 0x20;
    if ((local_19 & 1) != 0) {
      uVar5 = 9;
    }
    pcVar6 = spot_name(local_18[1]);
    bVar1 = local_18[2];
    uVar3 = *(uint *)(local_18 + 4);
    pcVar7 = spot_name(local_18[8]);
    pcVar10 = "";
    if (*local_18 == 1) {
      pcVar10 = "(reversed)";
    }
    printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n",(ulong)uVar5,pcVar6,
           (ulong)bVar1,(ulong)uVar3,pcVar7,(uint)local_18[9],*(undefined4 *)(local_18 + 0xc),
           pcVar10,local_428);
  }
  else if ((*local_18 == 2) && (local_450 != (Spot *)0x0)) {
    uVar5 = 0x20;
    if ((local_19 & 1) != 0) {
      uVar5 = 9;
    }
    pcVar6 = spot_name(local_18[1]);
    bVar1 = local_18[2];
    uVar3 = *(uint *)(local_18 + 4);
    pcVar7 = spot_name(local_18[8]);
    if (SBORROW4((uint)local_18[9],1)) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    uVar11 = *(undefined4 *)(local_18 + 0xc);
    printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (",(ulong)uVar5,pcVar6,(ulong)bVar1,
           (ulong)uVar3,pcVar7,local_18[9] - 1);
    local_428[0] = '\0';
    for (local_43b = 0; local_43b < local_18[9]; local_43b = local_43b + 1) {
      if (local_43b != 0) {
        printf(", ");
      }
      pSVar8 = board_spotGet(local_10,local_18[8],local_43b);
      pcVar6 = card_print((Card *)CONCAT44(in_stack_fffffffffffffae4,uVar11),
                          (_Bool)in_stack_fffffffffffffadf);
      if (pSVar8->cardsCount == '\0') {
        local_4e0 = "TOP";
      }
      else {
        if (SBORROW4((uint)pSVar8->cardsCount,1)) {
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        local_4e0 = card_print((Card *)CONCAT44(in_stack_fffffffffffffae4,uVar11),
                               (_Bool)in_stack_fffffffffffffadf);
      }
      printf("%s => %s",pcVar6,local_4e0);
    }
    printf(")\n");
  }
  else if (*local_18 == 3) {
    uVar9 = 0x20;
    if ((local_19 & 1) != 0) {
      uVar9 = 9;
    }
    printf("%c      MULTIPLE\n",uVar9);
    movePack_print(in_stack_fffffffffffffaf0,in_stack_fffffffffffffae8,
                   SUB41((uint)in_stack_fffffffffffffae4 >> 0x18,0));
  }
  else {
    bVar1 = *local_18;
    pcVar6 = spot_name(local_18[1]);
    bVar2 = local_18[2];
    uVar5 = *(uint *)(local_18 + 4);
    pcVar7 = spot_name(local_18[8]);
    printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n",(ulong)bVar1,pcVar6,
           (ulong)bVar2,(ulong)uVar5,pcVar7,(uint)local_18[9],*(undefined4 *)(local_18 + 0xc));
  }
  return;
}

Assistant:

void move_print(Board * board, Move * move, bool indent)
{
	char buf[1024];
	Spot * fromSpot = (move->type==MULTIPLE ? 0 : board_spotGet(board, move->fromSpotType, move->fromSpotIndex));
	Spot * toSpot = (move->type==MOVE || move->type==MOVEREVERSED ? board_spotGet(board, move->toSpotType, move->toSpotIndex) : 0);
	unsigned char fromSpotCardIndex = (fromSpot==0 ? 0 : (move->fromSpotCardIndex==-1 ? (fromSpot->cardsCount-1) : move->fromSpotCardIndex));
	unsigned char toSpotCardIndex = (toSpot==0 ? 0 : (move->toSpotCardIndex==-1 ? (toSpot->cardsCount-1) : move->toSpotCardIndex));
	unsigned char i=0;
	Card * toCard = (toSpot==0 ? 0 : (toSpot->cardsCount==0 ? 0 : toSpot->cards[toSpotCardIndex]));

	if((move->type==MOVE || move->type==MOVEREVERSED) && fromSpot)
	{
		sprintf(buf, "%s => %s", cards_print(&fromSpot->cards[fromSpotCardIndex], fromSpot->cardsCount-fromSpotCardIndex, false), toCard==0 ? "TOP" : cards_print(&toSpot->cards[toSpotCardIndex], toSpot->cardsCount-toSpotCardIndex, false));
		printf("%c          MOVE %10s%02d %2d => %10s%02d   %2d %s (%s)\n", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex, move->type==MOVEREVERSED ? "(reversed)" : "", buf);	
	}
	else if(move->type==MOVEDISTRIBUTE && fromSpot)
	{
		printf("%cMOVEDISTRIBUTE %10s%02d %2d => %10s0-%02d %2d (", (indent ? '\t' : ' '), spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex-1, move->toSpotCardIndex);

		buf[0] = 0;
		for(i=0;i<move->toSpotIndex;i++)
		{
			if(i>0)
				printf(", ");

			toSpot = board_spotGet(board, move->toSpotType, i);
			printf("%s => %s", card_print(fromSpot->cards[(fromSpotCardIndex-i)], false), toSpot->cardsCount==0 ? "TOP" : (card_print(toSpot->cards[(toSpot->cardsCount-1)], false)));
		}
		printf(")\n");
	}
	else if(move->type==MULTIPLE)
	{
		printf("%c      MULTIPLE\n", (indent ? '\t' : ' '));
		movePack_print(board, move->movePack, true);
	}
	else
	{
		printf("Unknown or invalid formatted move %d %s-%d:%d %s-%d:%d\n", move->type, spot_name(move->fromSpotType), move->fromSpotIndex, move->fromSpotCardIndex, spot_name(move->toSpotType), move->toSpotIndex, move->toSpotCardIndex);
	}
}